

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::PLOCAL_INC(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *a,SQObjectPtr *incr)

{
  bool bVar1;
  SQObjectPtr trg;
  SQObject local_28;
  
  local_28._unVal.pTable = (SQTable *)0x0;
  local_28._type = OT_NULL;
  local_28._flags = '\0';
  local_28._5_3_ = 0;
  bVar1 = ARITH_OP(this,op,(SQObjectPtr *)&local_28,a,incr);
  if (bVar1) {
    SQObjectPtr::operator=(target,a);
    SQObjectPtr::operator=(a,(SQObjectPtr *)&local_28);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_28);
  return bVar1;
}

Assistant:

bool SQVM::PLOCAL_INC(SQInteger op,SQObjectPtr &target, SQObjectPtr &a, SQObjectPtr &incr)
{
    SQObjectPtr trg;
    _RET_ON_FAIL(ARITH_OP( op , trg, a, incr));
    target = a;
    a = trg;
    return true;
}